

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_codes_writer.c
# Opt level: O0

void aom_write_primitive_refsubexpfin(aom_writer *w,uint16_t n,uint16_t k,uint16_t ref,uint16_t v)

{
  undefined2 in_CX;
  uint16_t in_DX;
  uint16_t in_SI;
  undefined2 in_R8W;
  uint16_t in_stack_ffffffffffffffea;
  uint16_t uVar1;
  uint16_t uVar2;
  
  uVar1 = in_DX;
  uVar2 = in_SI;
  recenter_finite_nonneg(0,0x3b,0x679);
  write_primitive_subexpfin
            ((aom_writer *)CONCAT26(uVar2,CONCAT24(uVar1,CONCAT22(in_CX,in_R8W))),in_DX,in_SI,
             in_stack_ffffffffffffffea);
  return;
}

Assistant:

void aom_write_primitive_refsubexpfin(aom_writer *w, uint16_t n, uint16_t k,
                                      uint16_t ref, uint16_t v) {
  write_primitive_subexpfin(w, n, k, recenter_finite_nonneg(n, ref, v));
}